

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.h
# Opt level: O1

void __thiscall LTFlightData::FDKeyTy::FDKeyTy(FDKeyTy *this,FDKeyType _eType,unsigned_long _num)

{
  string local_38;
  
  this->eKeyType = KEY_UNKNOWN;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  this->num = 0;
  SetKey_abi_cxx11_(&local_38,this,_eType,_num);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

FDKeyTy(FDKeyType _eType, unsigned long _num)                   { SetKey(_eType,_num); }